

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Targa.cpp
# Opt level: O2

void __thiscall targa_header::save(targa_header *this,DataSink *ds)

{
  (*ds->_vptr_DataSink[4])(ds,(ulong)(uint)(int)this->text_size);
  (*ds->_vptr_DataSink[4])(ds,(ulong)(uint)(int)this->map_type);
  (*ds->_vptr_DataSink[4])(ds,(ulong)(uint)(int)this->data_type);
  (*ds->_vptr_DataSink[5])(ds,(ulong)(ushort)this->map_org);
  (*ds->_vptr_DataSink[5])(ds,(ulong)(ushort)this->map_len);
  (*ds->_vptr_DataSink[4])(ds,(ulong)(uint)(int)this->cmap_bits);
  (*ds->_vptr_DataSink[5])(ds,(ulong)(ushort)this->x_offset);
  (*ds->_vptr_DataSink[5])(ds,(ulong)(ushort)this->y_offset);
  (*ds->_vptr_DataSink[5])(ds,(ulong)(ushort)this->width);
  (*ds->_vptr_DataSink[5])(ds,(ulong)(ushort)this->height);
  (*ds->_vptr_DataSink[4])(ds,(ulong)(uint)(int)this->data_bits);
  (*ds->_vptr_DataSink[4])(ds,(ulong)(uint)(int)this->im_type);
  return;
}

Assistant:

void targa_header::save(DataSink& ds)
{
    ds.write1(text_size);
    ds.write1(map_type);
    ds.write1(data_type);
    ds.write2(map_org);
    ds.write2(map_len);
    ds.write1(cmap_bits);
    ds.write2(x_offset);
    ds.write2(y_offset);
    ds.write2(width);
    ds.write2(height);
    ds.write1(data_bits);
    ds.write1(im_type);
}